

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall GlobOptBlockData::InitBlockData(GlobOptBlockData *this,GlobOpt *globOpt,Func *func)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  bool bVar2;
  ValueHashTable<Sym_*,_Value_*> *pVVar3;
  ValueHashTable<ExprHash,_Value_*> *pVVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_02;
  undefined4 *puVar6;
  bool *pbVar7;
  
  this->globOpt = globOpt;
  allocator = globOpt->alloc;
  pVVar3 = ValueHashTable<Sym_*,_Value_*>::New(allocator,0x40);
  this->symToValueMap = pVVar3;
  pVVar4 = ValueHashTable<ExprHash,_Value_*>::New(allocator,0x40);
  this->exprToValueMap = pVVar4;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->liveFields = pBVar5;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->liveArrayValues = pBVar5;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->isTempSrc = pBVar5;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->liveVarSyms = pBVar5;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->liveInt32Syms = pBVar5;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->liveLossyInt32Syms = pBVar5;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->liveFloat64Syms = pBVar5;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->argObjSyms = pBVar5;
  this->maybeTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->canStoreTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this_00 = (BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::JitArenaAllocator>(0x38,allocator,0x3eba5c);
  JsUtil::
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,allocator,0);
  this->valuesToKillOnCalls = (ValueSet *)this_00;
  bVar2 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar2) {
    if (this->globOpt->prePassLoop == (Loop *)0x0) {
      this_01 = (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)0x0;
    }
    else {
      this_01 = (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::JitArenaAllocator>(0x38,allocator,0x3eba5c);
      JsUtil::
      BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,allocator,0);
    }
    this->inductionVariables = (InductionVariableSet *)this_01;
    this_02 = (BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,allocator,0x3eba5c);
    JsUtil::
    BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_02,allocator,0);
    this->availableIntBoundChecks = (IntBoundCheckSet *)this_02;
  }
  this->maybeWrittenTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  this->startCallCount = 0;
  this->argOutCount = 0;
  this->totalOutParamCount = 0;
  this->inlinedArgOutSize = 0;
  this->hasCSECandidates = false;
  this->curFunc = func;
  pBVar5 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
  pBVar5->head = (Type_conflict)0x0;
  pBVar5->lastFoundIndex = (Type_conflict)0x0;
  pBVar5->alloc = allocator;
  pBVar5->lastUsedNodePrevNextField = (Type)pBVar5;
  this->changedSyms = pBVar5;
  if (allocator == (JitArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.h"
                       ,0xd0,"(allocator)","allocator");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pbVar7 = (bool *)new<Memory::JitArenaAllocator>(1,allocator,0x3eba5c);
  *pbVar7 = true;
  this->hasDataRef = pbVar7;
  return;
}

Assistant:

void
GlobOptBlockData::InitBlockData(GlobOpt* globOpt, Func* func)
{
    this->globOpt = globOpt;

    JitArenaAllocator *const alloc = this->globOpt->alloc;

    this->symToValueMap = GlobHashTable::New(alloc, 64);
    this->exprToValueMap = ExprHashTable::New(alloc, 64);
    this->liveFields = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveArrayValues = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->isTempSrc = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveVarSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveLossyInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFloat64Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->argObjSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->maybeTempObjectSyms = nullptr;
    this->canStoreTempObjectSyms = nullptr;
    this->valuesToKillOnCalls = JitAnew(alloc, ValueSet, alloc);

    if(this->globOpt->DoBoundCheckHoist())
    {
        this->inductionVariables = this->globOpt->IsLoopPrePass() ? JitAnew(alloc, InductionVariableSet, alloc) : nullptr;
        this->availableIntBoundChecks = JitAnew(alloc, IntBoundCheckSet, alloc);
    }

    this->maybeWrittenTypeSyms = nullptr;
    this->callSequence = nullptr;
    this->startCallCount = 0;
    this->argOutCount = 0;
    this->totalOutParamCount = 0;
    this->inlinedArgOutSize = 0;
    this->hasCSECandidates = false;
    this->curFunc = func;

    this->stackLiteralInitFldDataMap = nullptr;

    this->changedSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

    this->OnDataInitialized(alloc);
}